

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsFragmentOpUtil.cpp
# Opt level: O0

void __thiscall
deqp::gls::FragmentOpUtil::ReferenceQuadRenderer::render
          (ReferenceQuadRenderer *this,PixelBufferAccess *colorBuffer,PixelBufferAccess *depthBuffer
          ,PixelBufferAccess *stencilBuffer,IntegerQuad *quad,FragmentOperationState *state)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  int local_200;
  int local_1f8;
  MultisamplePixelBufferAccess local_1e0;
  MultisamplePixelBufferAccess local_1b8;
  MultisamplePixelBufferAccess local_190;
  GenericVec4 local_168;
  GenericVec4 local_158;
  Vector<int,_2> local_148;
  Fragment local_140;
  MultisamplePixelBufferAccess local_108;
  MultisamplePixelBufferAccess local_e0;
  MultisamplePixelBufferAccess local_b8;
  float local_8c;
  undefined1 local_88 [4];
  float depth;
  Vec4 color1;
  Vec4 color;
  float xRatio;
  int x;
  float yRatio;
  int y;
  float height;
  float width;
  int yLast;
  int yFirst;
  int xLast;
  int xFirst;
  FaceType faceType;
  bool flipY;
  bool flipX;
  FragmentOperationState *state_local;
  IntegerQuad *quad_local;
  PixelBufferAccess *stencilBuffer_local;
  PixelBufferAccess *depthBuffer_local;
  PixelBufferAccess *colorBuffer_local;
  ReferenceQuadRenderer *this_local;
  
  iVar3 = tcu::Vector<int,_2>::x(&quad->posA);
  iVar4 = tcu::Vector<int,_2>::x(&quad->posB);
  bVar1 = iVar4 < iVar3;
  iVar3 = tcu::Vector<int,_2>::y(&quad->posA);
  iVar4 = tcu::Vector<int,_2>::y(&quad->posB);
  bVar2 = iVar4 < iVar3;
  if (bVar1) {
    fVar5 = (float)tcu::Vector<int,_2>::x(&quad->posB);
    local_1f8 = tcu::Vector<int,_2>::x(&quad->posA);
  }
  else {
    fVar5 = (float)tcu::Vector<int,_2>::x(&quad->posA);
    local_1f8 = tcu::Vector<int,_2>::x(&quad->posB);
  }
  if (bVar2) {
    iVar3 = tcu::Vector<int,_2>::y(&quad->posB);
    local_200 = tcu::Vector<int,_2>::y(&quad->posA);
  }
  else {
    iVar3 = tcu::Vector<int,_2>::y(&quad->posA);
    local_200 = tcu::Vector<int,_2>::y(&quad->posB);
  }
  for (x = iVar3; x <= local_200; x = x + 1) {
    xRatio = ((float)(x - iVar3) + 0.5) / (float)((local_200 - iVar3) + 1);
    color.m_data[3] = fVar5;
    if (bVar2) {
      xRatio = 1.0 - xRatio;
    }
    for (; (int)color.m_data[3] <= local_1f8; color.m_data[3] = (float)((int)color.m_data[3] + 1)) {
      color.m_data[2] =
           ((float)((int)color.m_data[3] - (int)fVar5) + 0.5) /
           (float)((local_1f8 - (int)fVar5) + 1);
      if (bVar1) {
        color.m_data[2] = 1.0 - color.m_data[2];
      }
      triQuadInterpolate<tcu::Vector<float,4>>
                ((FragmentOpUtil *)(color1.m_data + 2),quad->color,color.m_data[2],xRatio);
      triQuadInterpolate<tcu::Vector<float,4>>
                ((FragmentOpUtil *)local_88,quad->color1,color.m_data[2],xRatio);
      local_8c = triQuadInterpolate<float>(quad->depth,color.m_data[2],xRatio);
      if (0x3ff < this->m_fragmentBufferSize) {
        rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_b8,colorBuffer);
        rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_e0,depthBuffer);
        rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_108,stencilBuffer);
        flushFragmentBuffer(this,&local_b8,&local_e0,&local_108,(uint)(bVar1 != bVar2),state);
      }
      this->m_fragmentDepths[this->m_fragmentBufferSize] = local_8c;
      tcu::Vector<int,_2>::Vector(&local_148,(int)color.m_data[3],x);
      rr::GenericVec4::GenericVec4<float>(&local_158,(Vector<float,_4> *)(color1.m_data + 2));
      rr::GenericVec4::GenericVec4<float>(&local_168,(Vector<float,_4> *)local_88);
      rr::Fragment::Fragment
                (&local_140,&local_148,&local_158,&local_168,1,
                 this->m_fragmentDepths + this->m_fragmentBufferSize);
      rr::Fragment::operator=(this->m_fragmentBuffer + this->m_fragmentBufferSize,&local_140);
      this->m_fragmentBufferSize = this->m_fragmentBufferSize + 1;
    }
  }
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_190,colorBuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_1b8,depthBuffer);
  rr::MultisamplePixelBufferAccess::fromMultisampleAccess(&local_1e0,stencilBuffer);
  flushFragmentBuffer(this,&local_190,&local_1b8,&local_1e0,(uint)(bVar1 != bVar2),state);
  return;
}

Assistant:

void ReferenceQuadRenderer::render (const tcu::PixelBufferAccess&			colorBuffer,
									const tcu::PixelBufferAccess&			depthBuffer,
									const tcu::PixelBufferAccess&			stencilBuffer,
									const IntegerQuad&						quad,
									const rr::FragmentOperationState&		state)
{
	bool			flipX			= quad.posA.x() > quad.posB.x();
	bool			flipY			= quad.posA.y() > quad.posB.y();
	rr::FaceType	faceType		= flipX == flipY ? rr::FACETYPE_FRONT : rr::FACETYPE_BACK;
	int				xFirst			= flipX ? quad.posB.x() : quad.posA.x();
	int				xLast			= flipX ? quad.posA.x() : quad.posB.x();
	int				yFirst			= flipY ? quad.posB.y() : quad.posA.y();
	int				yLast			= flipY ? quad.posA.y() : quad.posB.y();
	float			width			= (float)(xLast - xFirst + 1);
	float			height			= (float)(yLast - yFirst + 1);

	for (int y = yFirst; y <= yLast; y++)
	{
		// Interpolation factor for y.
		float yRatio = (0.5f + (float)(y - yFirst)) / height;
		if (flipY)
			yRatio = 1.0f - yRatio;

		for (int x = xFirst; x <= xLast; x++)
		{
			// Interpolation factor for x.
			float xRatio = (0.5f + (float)(x - xFirst)) / width;
			if (flipX)
				xRatio = 1.0f - xRatio;

			tcu::Vec4	color	= triQuadInterpolate(quad.color, xRatio, yRatio);
			tcu::Vec4	color1	= triQuadInterpolate(quad.color1, xRatio, yRatio);
			float		depth	= triQuadInterpolate(quad.depth, xRatio, yRatio);

			// Interpolated color and depth.

			DE_STATIC_ASSERT(MAX_FRAGMENT_BUFFER_SIZE == DE_LENGTH_OF_ARRAY(m_fragmentBuffer));

			if (m_fragmentBufferSize >= MAX_FRAGMENT_BUFFER_SIZE)
				flushFragmentBuffer(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer),
									rr::MultisamplePixelBufferAccess::fromMultisampleAccess(depthBuffer),
									rr::MultisamplePixelBufferAccess::fromMultisampleAccess(stencilBuffer), faceType, state);

			m_fragmentDepths[m_fragmentBufferSize] = depth;
			m_fragmentBuffer[m_fragmentBufferSize] = rr::Fragment(tcu::IVec2(x, y), rr::GenericVec4(color), rr::GenericVec4(color1), 1u /* coverage mask */, &m_fragmentDepths[m_fragmentBufferSize]);
			m_fragmentBufferSize++;
		}
	}

	flushFragmentBuffer(rr::MultisamplePixelBufferAccess::fromMultisampleAccess(colorBuffer),
						rr::MultisamplePixelBufferAccess::fromMultisampleAccess(depthBuffer),
						rr::MultisamplePixelBufferAccess::fromMultisampleAccess(stencilBuffer), faceType, state);
}